

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O1

void ultimateTest(void)

{
  System *pSVar1;
  Model *this;
  System *t;
  System *t_00;
  System *s;
  double dVar2;
  long *local_120 [2];
  long local_110 [2];
  System *local_100;
  System *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Model *)Model::createModel();
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"sys1","");
  local_100 = (System *)(**(code **)(*(long *)this + 0x50))(0x4059000000000000,this,local_120);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"sys2","");
  t = (System *)(**(code **)(*(long *)this + 0x50))(0,this,local_120);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"sys3","");
  t_00 = (System *)(**(code **)(*(long *)this + 0x50))(0x4059000000000000,this,local_120);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"sys4","");
  s = (System *)(**(code **)(*(long *)this + 0x50))(0,this,local_120);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"sys5","");
  local_f8 = (System *)(**(code **)(*(long *)this + 0x50))(0,this,local_120);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"exp1","");
  Model::createFlow<FlowExp>(this,&local_50,s,local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"exp2","");
  Model::createFlow<FlowExp>(this,&local_70,local_100,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"exp3","");
  Model::createFlow<FlowExp>(this,&local_90,local_100,t_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"exp4","");
  Model::createFlow<FlowExp>(this,&local_b0,t,t_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"exp5","");
  Model::createFlow<FlowExp>(this,&local_d0,t_00,s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"exp6","");
  pSVar1 = local_f8;
  Model::createFlow<FlowExp>(this,&local_f0,t,local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  (*(code *)**(undefined8 **)this)(this,0,100);
  dVar2 = (double)(**(code **)(*(long *)local_100 + 8))();
  if (0.0001 <= ABS(dVar2 + -31.8513)) {
    __assert_fail("fabs(q1->getValue() - 31.8513) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x2d,"void ultimateTest()");
  }
  dVar2 = (double)(**(code **)(*(long *)t + 8))(t);
  if (0.0001 <= ABS(dVar2 + -18.4003)) {
    __assert_fail("fabs(q2->getValue() - 18.4003) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x2e,"void ultimateTest()");
  }
  dVar2 = (double)(**(code **)(*(long *)t_00 + 8))(t_00);
  if (ABS(dVar2 + -77.1143) < 0.0001) {
    dVar2 = (double)(**(code **)(*(long *)s + 8))(s);
    if (0.0001 <= ABS(dVar2 + -56.1728)) {
      __assert_fail("fabs(q4->getValue() - 56.1728) < 0.0001",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                    ,0x30,"void ultimateTest()");
    }
    dVar2 = (double)(**(code **)(*(long *)pSVar1 + 8))(pSVar1);
    if (ABS(dVar2 + -16.4612) < 0.0001) {
      return;
    }
    __assert_fail("fabs(q5->getValue() - 16.4612) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x31,"void ultimateTest()");
  }
  __assert_fail("fabs(q3->getValue() - 77.1143) < 0.0001",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,0x2f,"void ultimateTest()");
}

Assistant:

void ultimateTest(){
    auto *m = Model::createModel();
    auto *q1 = m->createSystem("sys1",100);
    auto *q2 = m->createSystem("sys2",0.0);
    auto *q3 = m->createSystem("sys3",100);
    auto *q4 = m->createSystem("sys4",0.0);
    auto *q5 = m->createSystem("sys5",0.0);
    m->createFlow<FlowExp>("exp1", q4, q1);
    m->createFlow<FlowExp>("exp2", q1, q2);
    m->createFlow<FlowExp>("exp3", q1, q3);
    m->createFlow<FlowExp>("exp4", q2, q3);
    m->createFlow<FlowExp>("exp5", q3, q4);
    m->createFlow<FlowExp>("exp6", q2, q5);


    m->execute(0, 100);

    assert(fabs(q1->getValue() - 31.8513) < 0.0001);
    assert(fabs(q2->getValue() - 18.4003) < 0.0001);
    assert(fabs(q3->getValue() - 77.1143) < 0.0001);
    assert(fabs(q4->getValue() - 56.1728) < 0.0001);
    assert(fabs(q5->getValue() - 16.4612) < 0.0001);

}